

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

string * __thiscall
pbrt::ImageChannelValues::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ImageChannelValues *this)

{
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RCX;
  
  StringPrintf<pbrt::InlinedVector<float,4,pstd::pmr::polymorphic_allocator<float>>&>
            (__return_storage_ptr__,(pbrt *)"[ ImageChannelValues %s ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageChannelValues::ToString() const {
    return StringPrintf("[ ImageChannelValues %s ]", ((InlinedVector<Float, 4> &)*this));
}